

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O3

double __thiscall standards::exp_number<double>::log(exp_number<double> *this,double __x)

{
  range_error *this_00;
  
  if (this->sign_ == 1) {
    return this->log_;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"exp_number::log() for negative value");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

value_type log() const {
    if (sign_ != is_positive) throw std::range_error("exp_number::log() for negative value");
    return log_;
  }